

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void destroy_free<CB_EXPLORE_ADF::cb_explore_adf>(void *temp)

{
  if (*(void **)((long)temp + 0x238) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0x238));
  }
  if (*(void **)((long)temp + 0x220) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0x220));
  }
  if (*(void **)((long)temp + 0x208) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0x208));
  }
  if (*(void **)((long)temp + 0x1f0) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0x1f0));
  }
  if (*(void **)((long)temp + 0xe0) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0xe0));
  }
  if (*(void **)((long)temp + 0x38) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0x38));
  }
  if (*(void **)((long)temp + 0x20) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0x20));
  }
  free(temp);
  return;
}

Assistant:

void destroy_free(void* temp)
{
  ((T*)temp)->~T();
  free(temp);
}